

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sandbox.cpp
# Opt level: O1

void __thiscall
Sandbox::replayPoke(Sandbox *this,AccessType type,u32 addr,u64 cycle,u32 fc,u16 value)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  InstrInfo IVar4;
  
  if (this->enabled == true) {
    IVar4 = moira::Moira::getInstrInfo(&moiracpu->super_Moira,::opcode);
    if ((IVar4.S != 4 || IVar4.I != CLR) && ((IVar4.I != CHK || (cpuModel == M68000)))) {
      iVar1 = this->recordCnt;
      if (0 < (long)iVar1) {
        uVar2 = this->replayCnt;
        lVar3 = 0;
        do {
          if (((((ulong)uVar2 << 5 == lVar3) &&
               (*(AccessType *)((long)&this->access[0].type + lVar3) == type)) &&
              (*(u32 *)((long)&this->access[0].addr + lVar3) == addr)) &&
             ((*(u16 *)((long)&this->access[0].value + lVar3) == value &&
              (*(u32 *)((long)&this->access[0].fc + lVar3) == fc)))) {
            this->replayCnt = uVar2 + 1;
            if ((int)uVar2 < iVar1) {
              return;
            }
            break;
          }
          lVar3 = lVar3 + 0x20;
        } while ((long)iVar1 << 5 != lVar3);
      }
      error(this,type,addr,cycle,fc,value);
      return;
    }
  }
  return;
}

Assistant:

void
Sandbox::replayPoke(AccessType type, u32 addr, u64 cycle, u32 fc, u16 value)
{
    if (!enabled) return;

    auto info = moiracpu->getInstrInfo(opcode);

    // Ignore some opcodes that are handled differently by Moira
    if (info.I == Instr::CLR && info.S == Long) return;
    if (info.I == Instr::CHK && cpuModel != Model::M68000) return;

    for (int i = 0; i < recordCnt; i++) {

        // Enable for strict checking
        if (i != replayCnt) continue;

        // Check for a matching entry
        if (access[i].type != type) continue;
        if (access[i].addr != addr) continue;
        if (access[i].value != value) continue;
        if (access[i].fc != fc) continue;
        if (!MOIRA_MIMIC_MUSASHI) {
            if (access[i].cycle != cycle) continue;
        }

        // Match found
        replayCnt++;
        if (replayCnt > recordCnt) { break; }
        return;
    }

    error(type, addr, cycle, fc, value);
}